

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

key_view __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::get_key
          (iterator *this)

{
  bool bVar1;
  node_type nVar2;
  reference this_00;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this_01;
  key_view kVar3;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *leaf;
  node_ptr *node;
  value_type *e;
  iterator *this_local;
  
  bVar1 = valid(this);
  if (!bVar1) {
    __assert_fail("valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                  ,0x53b,
                  "key_view unodb::db<unsigned long, std::span<const std::byte>>::iterator::get_key() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  this_00 = std::
            stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
            ::top(&this->stack_);
  nVar2 = detail::basic_node_ptr<unodb::detail::node_header>::type(&this_00->node);
  if (nVar2 == LEAF) {
    this_01 = detail::basic_node_ptr<unodb::detail::node_header>::
              ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>
                        (&this_00->node);
    kVar3 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::get_key_view(this_01);
    return kVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x544,
                "key_view unodb::db<unsigned long, std::span<const std::byte>>::iterator::get_key() [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

key_view db<Key, Value>::iterator::get_key() noexcept {
  UNODB_DETAIL_ASSERT(valid());  // by contract
  // TODO(thompsonbry) : variable length keys. The simplest case
  // where this does not work today is a single root leaf.  In that
  // case, there is no inode path and we can not properly track the
  // key in the key_buffer.
  //
  // return keybuf_.get_key_view();
  const auto& e = stack_.top();
  const auto& node = e.node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
  const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf.
  return leaf->get_key_view();
}